

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameBase.cpp
# Opt level: O1

void __thiscall BayesianGameBase::ChangeNrTypes(BayesianGameBase *this,Index agI,size_t new_nr)

{
  pointer puVar1;
  
  puVar1 = (this->_m_nrTypes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)agI <
      (ulong)((long)(this->_m_nrTypes).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar1 >> 3)) {
    puVar1[agI] = new_nr;
    Initialize(this);
    return;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

void BayesianGameBase::ChangeNrTypes(Index agI, size_t new_nr)
{
    _m_nrTypes.at(agI) = new_nr;
    Initialize();
}